

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.cpp
# Opt level: O0

int mbedtls_asn1_get_bitstring(uchar **p,uchar *end,mbedtls_asn1_bitstring *bs)

{
  long *in_RDX;
  uchar **in_RSI;
  long *in_RDI;
  int ret;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = mbedtls_asn1_get_tag
                      (in_RSI,(uchar *)in_RDX,
                       (size_t *)CONCAT44(0xffffff92,in_stack_ffffffffffffffd8),0);
  if (local_4 == 0) {
    if (*in_RDX == 0) {
      local_4 = -0x60;
    }
    else {
      *in_RDX = *in_RDX + -1;
      *(undefined1 *)(in_RDX + 1) = *(undefined1 *)*in_RDI;
      if (*(byte *)(in_RDX + 1) < 8) {
        *in_RDI = *in_RDI + 1;
        in_RDX[2] = *in_RDI;
        *in_RDI = *in_RDX + *in_RDI;
        if ((uchar **)*in_RDI == in_RSI) {
          local_4 = 0;
        }
        else {
          local_4 = -0x66;
        }
      }
      else {
        local_4 = -100;
      }
    }
  }
  return local_4;
}

Assistant:

int mbedtls_asn1_get_bitstring(unsigned char **p, const unsigned char *end,
                               mbedtls_asn1_bitstring *bs)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    /* Certificate type is a single byte bitstring */
    if ((ret = mbedtls_asn1_get_tag(p, end, &bs->len, MBEDTLS_ASN1_BIT_STRING)) != 0) {
        return ret;
    }

    /* Check length, subtract one for actual bit string length */
    if (bs->len < 1) {
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }
    bs->len -= 1;

    /* Get number of unused bits, ensure unused bits <= 7 */
    bs->unused_bits = **p;
    if (bs->unused_bits > 7) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }
    (*p)++;

    /* Get actual bitstring */
    bs->p = *p;
    *p += bs->len;

    if (*p != end) {
        return MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
    }

    return 0;
}